

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O0

Gia_Man_t * Acec_ManDerive(Gia_Man_t *p,Vec_Int_t *vMirrors)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vMirrors_local;
  Gia_Man_t *p_local;
  
  if (p->pMuxes == (uint *)0x0) {
    Gia_ManFillValue(p);
    iVar1 = Gia_ManObjNum(p);
    p_00 = Gia_ManStart(iVar1);
    pcVar3 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar3;
    pGVar4 = Gia_ManConst0(p);
    pGVar4->Value = 0;
    Gia_ManHashAlloc(p_00);
    local_2c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar5 = false;
      if (local_2c < iVar1) {
        pGStack_28 = Gia_ManCi(p,local_2c);
        bVar5 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      uVar2 = Gia_ManAppendCi(p_00);
      pGStack_28->Value = uVar2;
      local_2c = local_2c + 1;
    }
    local_2c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar5 = false;
      if (local_2c < iVar1) {
        pGStack_28 = Gia_ManCo(p,local_2c);
        bVar5 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Gia_ObjFaninId0p(p,pGStack_28);
      Acec_ManDerive_rec(p_00,p,iVar1,vMirrors);
      local_2c = local_2c + 1;
    }
    local_2c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar5 = false;
      if (local_2c < iVar1) {
        pGStack_28 = Gia_ManCo(p,local_2c);
        bVar5 = pGStack_28 != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Gia_ObjFanin0Copy(pGStack_28);
      uVar2 = Gia_ManAppendCo(p_00,iVar1);
      pGStack_28->Value = uVar2;
      local_2c = local_2c + 1;
    }
    Gia_ManHashStop(p_00);
    iVar1 = Gia_ManRegNum(p);
    Gia_ManSetRegNum(p_00,iVar1);
    return p_00;
  }
  __assert_fail("p->pMuxes == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecCl.c"
                ,0x4a,"Gia_Man_t *Acec_ManDerive(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Acec_ManDerive( Gia_Man_t * p, Vec_Int_t * vMirrors )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pMuxes == NULL );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachCo( p, pObj, i )
        Acec_ManDerive_rec( pNew, p, Gia_ObjFaninId0p(p, pObj), vMirrors );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}